

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall pg::Game::unsafe_permute(Game *this,int *mapping)

{
  int iVar1;
  int *piVar2;
  uint64_t *puVar3;
  string **ppsVar4;
  string *psVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long i;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  
  lVar9 = this->n_vertices;
  if (0 < lVar9) {
    piVar2 = this->strategy;
    lVar10 = 0;
    do {
      lVar13 = (long)piVar2[lVar10];
      if (lVar13 != -1) {
        piVar2[lVar10] = mapping[lVar13];
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  lVar10 = this->n_edges + lVar9;
  if (lVar10 != 0) {
    piVar2 = this->_outedges;
    lVar13 = 0;
    do {
      lVar15 = (long)piVar2[lVar13];
      if (lVar15 != -1) {
        piVar2[lVar13] = mapping[lVar15];
      }
      lVar13 = lVar13 + 1;
    } while (lVar10 != lVar13);
    piVar2 = this->_inedges;
    if (piVar2 != (int *)0x0) {
      lVar13 = 0;
      do {
        if ((long)piVar2[lVar13] != -1) {
          piVar2[lVar13] = mapping[piVar2[lVar13]];
        }
        lVar13 = lVar13 + 1;
      } while (lVar10 != lVar13);
    }
  }
  if (0 < lVar9) {
    uVar7 = 0;
    do {
      uVar18 = (ulong)(uint)mapping[uVar7];
      if (uVar7 != uVar18) {
        uVar14 = uVar7 >> 6;
        uVar16 = 1L << (uVar7 & 0x3f);
        bVar6 = (byte)uVar7 & 0x3f;
        uVar17 = -2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6;
        do {
          uVar8 = (ulong)(int)uVar18;
          mapping[uVar7] = mapping[uVar8];
          mapping[uVar8] = (int)uVar18;
          piVar2 = this->_priority;
          iVar1 = piVar2[uVar7];
          piVar2[uVar7] = piVar2[uVar8];
          piVar2[uVar8] = iVar1;
          uVar19 = uVar8 >> 6;
          puVar3 = (this->_owner)._bits;
          bVar6 = (byte)uVar18 & 0x3f;
          uVar11 = -2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6;
          uVar18 = puVar3[uVar19];
          uVar12 = uVar18 & ~(1L << (uVar8 & 0x3f));
          if ((puVar3[uVar14] & uVar16) != 0) {
            uVar12 = uVar18 | 1L << (uVar8 & 0x3f);
          }
          puVar3[uVar19] = uVar12;
          uVar12 = puVar3[uVar14] | uVar16;
          if ((uVar18 >> (uVar8 & 0x3f) & 1) == 0) {
            uVar12 = puVar3[uVar14] & uVar17;
          }
          puVar3[uVar14] = uVar12;
          ppsVar4 = this->_label;
          psVar5 = ppsVar4[uVar7];
          ppsVar4[uVar7] = ppsVar4[uVar8];
          ppsVar4[uVar8] = psVar5;
          piVar2 = this->_firstouts;
          iVar1 = piVar2[uVar7];
          piVar2[uVar7] = piVar2[uVar8];
          piVar2[uVar8] = iVar1;
          piVar2 = this->_outcount;
          iVar1 = piVar2[uVar7];
          piVar2[uVar7] = piVar2[uVar8];
          piVar2[uVar8] = iVar1;
          if (this->_inedges != (int *)0x0) {
            piVar2 = this->_firstins;
            iVar1 = piVar2[uVar7];
            piVar2[uVar7] = piVar2[uVar8];
            piVar2[uVar8] = iVar1;
            piVar2 = this->_incount;
            iVar1 = piVar2[uVar7];
            piVar2[uVar7] = piVar2[uVar8];
            piVar2[uVar8] = iVar1;
          }
          puVar3 = (this->solved)._bits;
          uVar20 = 1L << (uVar8 & 0x3f);
          uVar18 = puVar3[uVar19];
          uVar12 = uVar18 & uVar11;
          if ((puVar3[uVar14] & uVar16) != 0) {
            uVar12 = uVar18 | uVar20;
          }
          puVar3[uVar19] = uVar12;
          uVar12 = puVar3[uVar14] | uVar16;
          if ((uVar18 & uVar20) == 0) {
            uVar12 = puVar3[uVar14] & uVar17;
          }
          puVar3[uVar14] = uVar12;
          puVar3 = (this->winner)._bits;
          uVar18 = puVar3[uVar19];
          uVar12 = uVar11 & uVar18;
          if ((puVar3[uVar14] & uVar16) != 0) {
            uVar12 = uVar18 | uVar20;
          }
          puVar3[uVar19] = uVar12;
          uVar12 = puVar3[uVar14] | uVar16;
          if ((uVar18 & uVar20) == 0) {
            uVar12 = puVar3[uVar14] & uVar17;
          }
          puVar3[uVar14] = uVar12;
          piVar2 = this->strategy;
          iVar1 = piVar2[uVar7];
          piVar2[uVar7] = piVar2[uVar8];
          piVar2[uVar8] = iVar1;
          uVar18 = (ulong)(uint)mapping[uVar7];
        } while (uVar7 != uVar18);
        lVar9 = this->n_vertices;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < lVar9);
  }
  return;
}

Assistant:

void
Game::unsafe_permute(int *mapping)
{
    // first update vectors and arrays and the strategies
    for (int i=0; i<n_vertices; i++) {
        if (strategy[i] != -1) strategy[i] = mapping[strategy[i]];
    }
    unsigned long len = n_vertices + n_edges;
    for (unsigned long i=0; i<len; i++) {
        if (_outedges[i] != -1) _outedges[i] = mapping[_outedges[i]];
    }
    if (_inedges != NULL) {
        for (unsigned long i=0; i<len; i++) {
            if (_inedges[i] != -1) _inedges[i] = mapping[_inedges[i]];
        }
    }
    // swap nodes until done
    for (int i=0; i<n_vertices; i++) {
        // this is basically a loop, that swaps mapping[i] and i, until mapping[i] equals i.
        while (mapping[i] != i) {
            int k = mapping[i];
            mapping[i] = mapping[k];
            mapping[k] = k;
            // swap i and k
            std::swap(_priority[i], _priority[k]);
            { bool b = _owner[k]; _owner[k] = _owner[i]; _owner[i] = b; }
            std::swap(_label[i], _label[k]);
            // swap out array
            std::swap(_firstouts[i], _firstouts[k]);
            std::swap(_outcount[i], _outcount[k]);
            // swap in array
            if (_inedges != NULL) {
                std::swap(_firstins[i], _firstins[k]);
                std::swap(_incount[i], _incount[k]);
            }
            // swap solution
            { bool b = solved[k]; solved[k] = solved[i]; solved[i] = b; }
            { bool b = winner[k]; winner[k] = winner[i]; winner[i] = b; }
            std::swap(strategy[i], strategy[k]);
        }
    }
}